

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O0

void __thiscall UnifiedRegex::CharBitvec::SetRange(CharBitvec *this,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint local_2c;
  int w;
  int hio;
  int lo;
  int hw;
  int lw;
  uint h_local;
  uint l_local;
  CharBitvec *this_local;
  
  if (0xff < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5b,"(l < Size)","l < Size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (0xff < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5c,"(h < Size)","h < Size");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if ((l < 0x100) && (h < 0x100)) {
    if (l == h) {
      this->vec[l >> 5] = 1 << ((byte)l & 0x1f) | this->vec[l >> 5];
    }
    else if (l < h) {
      local_2c = l >> 5;
      uVar3 = h >> 5;
      if (local_2c == uVar3) {
        setrng(this->vec + (int)local_2c,l & 0x1f,h & 0x1f);
      }
      else {
        setrng(this->vec + (int)local_2c,l & 0x1f,0x1f);
        while (local_2c = local_2c + 1, (int)local_2c < (int)uVar3) {
          this->vec[(int)local_2c] = 0xffffffff;
        }
        setrng(this->vec + (int)uVar3,0,h & 0x1f);
      }
    }
  }
  return;
}

Assistant:

inline void SetRange(uint l, uint h)
        {
            Assert(l < Size);
            Assert(h < Size);
            __assume(l < Size);
            __assume(h < Size);
            if (l < Size && h < Size)
            {
                if (l == h)
                {
                    vec[l / wordSize] |= 1U << (l % wordSize);
                }
                else if (l < h)
                {
                    int lw = l / wordSize;
                    int hw = h / wordSize;
                    int lo = l % wordSize;
                    int hio = h % wordSize;
                    if (lw == hw)
                    {
                        setrng(vec[lw], lo, hio);
                    }
                    else
                    {
                        setrng(vec[lw], lo, wordSize - 1);
                        for (int w = lw + 1; w < hw; w++)
                        {
                            vec[w] = ones;
                        }
                        setrng(vec[hw], 0, hio);
                    }
                }
            }
        }